

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O0

void InstructionSet::M68k::Primitive::negative<true,unsigned_short>
               (unsigned_short *source,Status *status)

{
  ushort value;
  unsigned_short uVar1;
  unsigned_short result;
  Status *status_local;
  unsigned_short *source_local;
  
  value = -(ushort)(status->extend_flag != 0) - *source;
  status->zero_result = (ulong)value | status->zero_result;
  status->carry_flag = (ulong)value;
  status->extend_flag = (ulong)value;
  Status::set_negative<unsigned_short>(status,value);
  uVar1 = Numeric::overflow<false,unsigned_short>(0,*source,value);
  status->overflow_flag = (ulong)uVar1;
  *source = value;
  return;
}

Assistant:

void negative(IntT &source, Status &status) {
	const IntT result = -source - (is_extend && status.extend_flag ? 1 : 0);

	if constexpr (is_extend) {
		status.zero_result |= result;
	} else {
		status.zero_result = result;
	}
	status.extend_flag = status.carry_flag = result;	// i.e. any value other than 0 will result in carry.
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<false>(IntT(0), source, result);

	source = result;
}